

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivySeq.c
# Opt level: O2

void Ivy_CutCompactAll(Ivy_Store_t *pCutStore)

{
  Ivy_Cut_t *pIVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int *piVar4;
  int iVar5;
  short sVar6;
  short sVar7;
  short *psVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  
  pCutStore->nCutsM = 0;
  psVar8 = &pCutStore->pCuts[0].nSizeMax;
  iVar10 = 0;
  for (lVar9 = 0; lVar9 < pCutStore->nCuts; lVar9 = lVar9 + 1) {
    iVar11 = iVar10;
    if (psVar8[-1] != 0) {
      if (psVar8[-1] < *psVar8) {
        pCutStore->nCutsM = pCutStore->nCutsM + 1;
      }
      pIVar1 = (Ivy_Cut_t *)(psVar8 + -3);
      iVar11 = iVar10 + 1;
      pCutStore->pCuts[iVar10].uHash = *(uint *)(psVar8 + 0xd);
      iVar5 = pIVar1->nLatches;
      sVar6 = pIVar1->nSize;
      sVar7 = pIVar1->nSizeMax;
      uVar2 = *(undefined8 *)(psVar8 + 1);
      uVar3 = *(undefined8 *)(psVar8 + 9);
      piVar4 = pCutStore->pCuts[iVar10].pArray;
      *(undefined8 *)(piVar4 + 2) = *(undefined8 *)(psVar8 + 5);
      *(undefined8 *)(piVar4 + 4) = uVar3;
      pIVar1 = pCutStore->pCuts + iVar10;
      pIVar1->nLatches = iVar5;
      pIVar1->nSize = sVar6;
      pIVar1->nSizeMax = sVar7;
      *(undefined8 *)pIVar1->pArray = uVar2;
    }
    psVar8 = psVar8 + 0x12;
    iVar10 = iVar11;
  }
  pCutStore->nCuts = iVar10;
  return;
}

Assistant:

void Ivy_CutCompactAll( Ivy_Store_t * pCutStore )
{
    Ivy_Cut_t * pCut;
    int i, k;
    pCutStore->nCutsM = 0;
    for ( i = k = 0; i < pCutStore->nCuts; i++ )
    {
        pCut = pCutStore->pCuts + i;
        if ( pCut->nSize == 0 )
            continue;
        if ( pCut->nSize < pCut->nSizeMax )
            pCutStore->nCutsM++;
        pCutStore->pCuts[k++] = *pCut;
    }
    pCutStore->nCuts = k;
}